

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

int Internal_FloatArrayCompare(size_t count,float *a,float *b)

{
  int iVar1;
  float *pfVar2;
  bool bVar3;
  
  pfVar2 = a + 1;
  do {
    iVar1 = ON_CompareFloat(pfVar2[-1],*b);
    if (iVar1 != 0) {
      return iVar1;
    }
    b = b + 1;
    bVar3 = pfVar2 < a + count;
    pfVar2 = pfVar2 + 1;
  } while (bVar3);
  return 0;
}

Assistant:

static int Internal_FloatArrayCompare(
  size_t count,
  const float* a,
  const float* b
  )
{
  const float* e = a + count;
  int rc = ON_CompareFloat(*a++, *b++);
  while( 0 == rc && a < e)
    rc = ON_CompareFloat(*a++, *b++);
  return rc;
}